

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>::
operator()(CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>
           *this,_func_void_String_ptr_size_t *deleter,String *data,size_t size)

{
  long lVar1;
  
  if (deleter != (_func_void_String_ptr_size_t *)0x0) {
    (*deleter)(data,size);
    return;
  }
  if (data != (String *)0x0) {
    if (*(long *)(data + -8) != 0) {
      lVar1 = *(long *)(data + -8) * 0x18;
      do {
        Corrade::Containers::String::~String(data + lVar1 + -0x18);
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != 0);
    }
    operator_delete__(data + -8);
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }